

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

bool tcu::anyNotEqual<float,2>(Vector<float,_2> *a,Vector<float,_2> *b)

{
  bool bVar1;
  bool bVar2;
  int local_20;
  int i;
  bool res;
  Vector<float,_2> *b_local;
  Vector<float,_2> *a_local;
  
  bVar1 = false;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    bVar2 = !bVar1;
    bVar1 = true;
    if (bVar2) {
      bVar1 = a->m_data[local_20] != b->m_data[local_20];
    }
  }
  return bVar1;
}

Assistant:

inline bool anyNotEqual (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	bool res = false;
	for (int i = 0; i < Size; i++)
		res = res || a.m_data[i] != b.m_data[i];
	return res;
}